

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O3

void __thiscall
compiler::CompilerAstWalker::onEnterLiteralExpressionAstNode
          (CompilerAstWalker *this,LiteralExpressionAstNode *node)

{
  char *pcVar1;
  int iVar2;
  element_type *peVar3;
  int *piVar4;
  long t;
  size_t sVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  ByteCodeInstruction instruction;
  pointer pcVar8;
  double t_00;
  ByteCode bc;
  ByteCode bc_00;
  ByteCode bc_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  
  peVar3 = (node->token).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  switch(peVar3->tokenType) {
  case BooleanLiteral:
    iVar2 = std::__cxx11::string::compare((char *)peVar3);
    if (iVar2 == 0) {
      instruction = LoadBooleanTrueConstant;
      goto LAB_0011ac35;
    }
    iVar2 = std::__cxx11::string::compare
                      ((char *)(node->token).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    if (iVar2 == 0) {
      instruction = LoadBooleanFalseConstant;
      goto LAB_0011ac35;
    }
    local_50 = (undefined1  [8])&str._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,
               "Encountered unknown boolean literal value in AstCompiler.cpp onEnterLiteralExpressionAstNode"
               ,"");
    Error::assertWithPanic(false,(string *)local_50);
    break;
  case UndefinedLiteral:
    instruction = LoadUndefinedConstant;
LAB_0011ac35:
    emit(this,instruction);
    return;
  default:
    local_50 = (undefined1  [8])&str._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,
               "Encountered unknown literal type in AstCompiler.cpp onEnterLiteralExpressionAstNode"
               ,"");
    Error::assertWithPanic(false,(string *)local_50);
    break;
  case StringLiteral:
    std::__cxx11::string::substr((ulong)local_50,(ulong)peVar3);
    if (str._M_dataplus._M_p == (pointer)0x0) {
      _Var7._M_p = (pointer)0x0;
    }
    else {
      pcVar8 = (pointer)0x0;
      _Var7 = str._M_dataplus;
      do {
        if (((pcVar8 < _Var7._M_p + -1) && (*(char *)((long)local_50 + (long)pcVar8) == '\\')) &&
           (((char *)((long)local_50 + 1))[(long)pcVar8] == 'n')) {
          std::__cxx11::string::replace((ulong)local_50,(ulong)pcVar8,(char *)0x2,0x122553);
          std::__cxx11::string::_M_assign((string *)local_50);
          _Var7 = str._M_dataplus;
        }
        pcVar8 = pcVar8 + 1;
      } while (pcVar8 < _Var7._M_p);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_50,_Var7._M_p + (long)local_50);
    sVar5 = indexOfConstant<std::__cxx11::string>
                      (this,&local_70,&this->stringConstants,&this->stringConstantsLookup);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bc_01.parameter = sVar5;
    bc_01._0_8_ = 0xb;
    EmissionContext::EmitByteCode
              ((this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,bc_01);
    if (local_50 == (undefined1  [8])&str._M_string_length) {
      return;
    }
    goto LAB_0011ac12;
  case IntegerLiteral:
    pcVar1 = (peVar3->value)._M_dataplus._M_p;
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    *piVar4 = 0;
    t = strtoll(pcVar1,(char **)local_50,10);
    if (local_50 == (undefined1  [8])pcVar1) {
      std::__throw_invalid_argument("stoll");
      goto LAB_0011ac54;
    }
    if (*piVar4 != 0) {
      if (*piVar4 != 0x22) goto LAB_0011ab37;
      peVar3 = (element_type *)std::__throw_out_of_range("stoll");
      goto switchD_0011a977_caseD_1b;
    }
    goto LAB_0011ab34;
  case FloatLiteral:
switchD_0011a977_caseD_1b:
    pcVar1 = (peVar3->value)._M_dataplus._M_p;
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    *piVar4 = 0;
    t_00 = strtod(pcVar1,(char **)local_50);
    if (local_50 == (undefined1  [8])pcVar1) {
LAB_0011ac54:
      uVar6 = std::__throw_invalid_argument("stod");
      __clang_call_terminate(uVar6);
    }
    if (*piVar4 == 0) {
      *piVar4 = iVar2;
LAB_0011ab66:
      sVar5 = indexOfConstant<double>(this,t_00,&this->floatConstants,&this->floatConstantsLookup);
      bc_00.parameter = sVar5;
      bc_00._0_8_ = 10;
      EmissionContext::EmitByteCode
                ((this->ec).
                 super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 bc_00);
      return;
    }
    if (*piVar4 != 0x22) goto LAB_0011ab66;
    t = std::__throw_out_of_range("stod");
LAB_0011ab34:
    *piVar4 = iVar2;
LAB_0011ab37:
    sVar5 = indexOfConstant<long>(this,t,&this->intConstants,&this->intConstantsLookup);
    bc.parameter = sVar5;
    bc._0_8_ = 9;
    EmissionContext::EmitByteCode
              ((this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,bc);
    return;
  }
  if (local_50 != (undefined1  [8])&str._M_string_length) {
LAB_0011ac12:
    operator_delete((void *)local_50,str._M_string_length + 1);
  }
  return;
}

Assistant:

void onEnterLiteralExpressionAstNode(LiteralExpressionAstNode* node) noexcept override {
    switch (node->token->tokenType) {
      case TokenType::BooleanLiteral: {
        if (node->token->value == "true") {
          this->emit(bytecode::ByteCodeInstruction::LoadBooleanTrueConstant);
        } else if (node->token->value == "false") {
          this->emit(bytecode::ByteCodeInstruction::LoadBooleanFalseConstant);
        } else {
          Error::assertWithPanic(false, "Encountered unknown boolean literal value in AstCompiler.cpp onEnterLiteralExpressionAstNode");
        }
        return;
      }
      case TokenType::FloatLiteral: {
        double val = std::stod(node->token->value);
        std::size_t index = this->indexOfConstant(val, this->floatConstants, this->floatConstantsLookup);
        this->emit(bytecode::ByteCodeInstruction::LoadFloatConstant, index);
        return;
      }
      case TokenType::IntegerLiteral: {
        std::int64_t val = std::stoll(node->token->value);
        std::size_t index = this->indexOfConstant(val, this->intConstants, this->intConstantsLookup);
        this->emit(bytecode::ByteCodeInstruction::LoadIntegerConstant, index);
        return;
      }
      case TokenType::UndefinedLiteral: {
        this->emit(bytecode::ByteCodeInstruction::LoadUndefinedConstant);
        return;
      }
      case TokenType::StringLiteral: {
        auto str = node->token->value.substr(1, node->token->value.length() - 2);
        for (std::size_t i = 0; i < str.length(); i++) {
          if (str.at(i) == '\\' && i < str.length() - 1 && str.at(i + 1) == 'n') {
            str = str.replace(i, 2, "\n");
          }
        }
        std::size_t index = this->indexOfConstant(str, this->stringConstants, this->stringConstantsLookup);
        this->emit(bytecode::ByteCodeInstruction::LoadStringConstant, index);
        return;
      }
      default: {
        Error::assertWithPanic(false, "Encountered unknown literal type in AstCompiler.cpp onEnterLiteralExpressionAstNode");
        return;
      }
    }
  }